

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvwriter.cc
# Opt level: O0

int64 __thiscall mkvmuxer::MkvWriter::Position(MkvWriter *this)

{
  MkvWriter *this_local;
  
  if (this->file_ == (FILE *)0x0) {
    this_local = (MkvWriter *)0x0;
  }
  else {
    this_local = (MkvWriter *)ftell((FILE *)this->file_);
  }
  return (int64)this_local;
}

Assistant:

int64 MkvWriter::Position() const {
  if (!file_)
    return 0;

#ifdef _MSC_VER
  return _ftelli64(file_);
#else
  return ftell(file_);
#endif
}